

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_enc.c
# Opt level: O1

int jpc_encode(jas_image_t *image,jas_stream_t *out,char *optstr)

{
  uint_fast16_t *__s;
  uint_fast32_t *puVar1;
  uint_fast32_t *puVar2;
  uint_fast8_t *puVar3;
  undefined8 *puVar4;
  long *plVar5;
  _Bool _Var6;
  byte bVar7;
  jas_image_cmpt_t *pjVar8;
  jas_image_cmpt_t *pjVar9;
  size_t num_elements;
  uint_fast16_t uVar10;
  jas_image_t *image_00;
  uint_fast32_t uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  jpc_enc_tcmpt_s *pjVar14;
  jpc_enc_rlvl_s *pjVar15;
  jpc_enc_prc_t *pjVar16;
  jpc_enc_rlvl_s *pjVar17;
  jpc_enc_band_s *pjVar18;
  jas_seqent_t *pjVar19;
  long lVar20;
  uint_fast8_t uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  jpc_enc_cp_t *pjVar25;
  jpc_enc_ccp_t *pjVar26;
  uint_fast32_t uVar27;
  jas_tvparser_t *tvp;
  jas_taginfo_t *pjVar28;
  uint_fast32_t uVar29;
  jpc_enc_t *enc;
  jpc_cstate_t *pjVar30;
  jpc_ms_t *pjVar31;
  jpc_sizcomp_t *pjVar32;
  size_t sVar33;
  uchar *puVar34;
  jpc_fix_t *pjVar35;
  jpc_tsfb_t *pjVar36;
  jpc_enc_tile_t *tile_00;
  uint_fast32_t *puVar37;
  jas_matrix_t *pjVar38;
  jpc_enc_prc_t *pjVar39;
  jpc_tagtree_t *pjVar40;
  jpc_enc_cblk_t *cblk;
  ulong uVar41;
  jpc_fix_t jVar42;
  jpc_enc_rlvl_t *pjVar43;
  jpc_enc_band_t *pjVar44;
  jas_seqent_t jVar45;
  jas_stream_t *pjVar46;
  jpc_pi_t *pjVar47;
  byte bVar48;
  byte bVar49;
  uint uVar50;
  uint uVar51;
  uint_fast32_t *puVar52;
  uint_fast32_t uVar53;
  ulong uVar54;
  uint_fast16_t uVar55;
  jpc_tsfb_t **ppjVar56;
  long lVar57;
  jpc_fix_t jVar58;
  jpc_enc_band_t *pjVar59;
  _Bool *p_Var60;
  int *piVar61;
  int iVar62;
  char *pcVar63;
  jpc_enc_tcmpt_t *pjVar64;
  jas_matrix_t **ppjVar65;
  ulong uVar66;
  char *pcVar67;
  long lVar68;
  jpc_enc_tcmpt_t *pjVar69;
  long lVar70;
  ulong uVar71;
  long lVar72;
  int iVar73;
  ulong ystart;
  ulong uVar74;
  ulong uVar75;
  long lVar76;
  bool bVar77;
  double dVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  double dVar87;
  undefined1 auVar88 [16];
  jpc_enc_tile_t *tile;
  int numilyrrates;
  jpc_tsfb_band_t bandinfos [100];
  ulong local_1778;
  jpc_enc_tcmpt_t *local_1770;
  jpc_enc_rlvl_t *local_1768;
  jpc_enc_cblk_t *local_1750;
  jpc_enc_cp_t *local_1748;
  jpc_enc_band_t *local_1740;
  ulong local_1738;
  jpc_enc_tcmpt_t *local_1730;
  ulong local_1720;
  ulong local_1718;
  ulong local_1710;
  ulong local_1708;
  ulong local_1700;
  uint local_16f8 [256];
  jpc_tsfb_band_t local_12f8 [100];
  
  jpc_initluts();
  local_12f8[0]._0_8_ = (void *)0x0;
  local_16f8[0] = 0;
  pjVar25 = (jpc_enc_cp_t *)jas_malloc(0x2d0);
  if (pjVar25 != (jpc_enc_cp_t *)0x0) {
    pjVar25->ccps = (jpc_enc_ccp_t *)0x0;
    pjVar25->debug = 0;
    *(undefined4 *)&pjVar25->imgareatlx = 0xffffffff;
    *(undefined4 *)((long)&pjVar25->imgareatlx + 4) = 0xffffffff;
    *(undefined4 *)&pjVar25->imgareatly = 0xffffffff;
    *(undefined4 *)((long)&pjVar25->imgareatly + 4) = 0xffffffff;
    pjVar25->refgrdwidth = 0;
    pjVar25->refgrdheight = 0;
    *(undefined4 *)&pjVar25->tilegrdoffx = 0xffffffff;
    *(undefined4 *)((long)&pjVar25->tilegrdoffx + 4) = 0xffffffff;
    *(undefined4 *)&pjVar25->tilegrdoffy = 0xffffffff;
    *(undefined4 *)((long)&pjVar25->tilegrdoffy + 4) = 0xffffffff;
    pjVar25->tilewidth = 0;
    pjVar25->tileheight = 0;
    uVar74 = (ulong)image->numcmpts_;
    pjVar25->numcmpts = uVar74;
    if (uVar74 == 0) {
      local_1738 = 1;
      lVar76 = 1;
    }
    else {
      pjVar8 = *image->cmpts_;
      lVar68 = pjVar8->hstep_;
      lVar76 = 1;
      bVar77 = true;
      if (image->brx_ < pjVar8->tlx_ + lVar68 + pjVar8->width_ * lVar68) {
        lVar57 = pjVar8->vstep_;
        local_1738 = 1;
        if (image->bry_ < pjVar8->tly_ + lVar57 + pjVar8->height_ * lVar57) {
          uVar75 = 1;
          do {
            uVar71 = uVar75;
            lVar76 = lVar57 * lVar76;
            local_1738 = local_1738 * lVar68;
            if (uVar74 == uVar71) goto LAB_0011e7fa;
            pjVar8 = image->cmpts_[uVar71];
            lVar68 = pjVar8->hstep_;
            if (pjVar8->tlx_ + lVar68 + pjVar8->width_ * lVar68 <= image->brx_) break;
            lVar57 = pjVar8->vstep_;
            uVar75 = uVar71 + 1;
          } while (image->bry_ < pjVar8->tly_ + lVar57 + pjVar8->height_ * lVar57);
          bVar77 = uVar71 < uVar74;
        }
      }
      else {
        local_1738 = 1;
      }
      jas_eprintf("unsupported image type\n");
      if (bVar77) goto LAB_0011efa7;
    }
LAB_0011e7fa:
    pjVar26 = (jpc_enc_ccp_t *)jas_alloc2(pjVar25->numcmpts,0x330);
    pjVar25->ccps = pjVar26;
    if (pjVar26 != (jpc_enc_ccp_t *)0x0) {
      if (pjVar25->numcmpts != 0) {
        uVar74 = 0;
        uVar75 = 1;
        do {
          pjVar8 = image->cmpts_[uVar74];
          pjVar26->sampgrdstepx = (uint_fast8_t)pjVar8->hstep_;
          pjVar26->sampgrdstepy = (uint_fast8_t)pjVar8->vstep_;
          pjVar26->sampgrdsubstepx = '\0';
          pjVar26->prec = (uint_fast8_t)pjVar8->prec_;
          pjVar26->sgnd = pjVar8->sgnd_ != 0;
          __s = &pjVar26->numstepsizes;
          pjVar26 = pjVar26 + 1;
          memset(__s,0,0x328);
          bVar77 = uVar75 < pjVar25->numcmpts;
          uVar74 = uVar75;
          uVar75 = (ulong)((int)uVar75 + 1);
        } while (bVar77);
      }
      uVar27 = jas_image_rawsize(image);
      pjVar25->rawsize = uVar27;
      if (uVar27 != 0) {
        pjVar25->totalsize = 0xffffffffffffffff;
        (pjVar25->tcp).intmode = true;
        (pjVar25->tcp).csty = '\0';
        (pjVar25->tcp).prg = '\0';
        (pjVar25->tcp).numlyrs = 1;
        (pjVar25->tcp).ilyrrates = (jpc_fix_t *)0x0;
        (pjVar25->tccp).csty = '\0';
        (pjVar25->tccp).maxrlvls = '\x06';
        (pjVar25->tccp).cblkwidthexpn = 6;
        (pjVar25->tccp).cblkheightexpn = 6;
        (pjVar25->tccp).cblksty = '\0';
        (pjVar25->tccp).numgbits = '\x02';
        pcVar63 = "";
        if (optstr != (char *)0x0) {
          pcVar63 = optstr;
        }
        tvp = jas_tvparser_create(pcVar63);
        if (tvp != (jas_tvparser_t *)0x0) {
          puVar37 = &pjVar25->imgareatlx;
          puVar1 = &pjVar25->tilegrdoffx;
          puVar2 = &pjVar25->tilewidth;
          iVar22 = jas_tvparser_next(tvp);
          if (iVar22 == 0) {
            uVar74 = 0xf;
            bVar77 = true;
            local_1778 = 0;
            uVar75 = 0xf;
            do {
              pcVar63 = jas_tvparser_gettag(tvp);
              pjVar28 = jas_taginfos_lookup(encopts,pcVar63);
              pjVar28 = jas_taginfo_nonull(pjVar28);
              switch(pjVar28->id) {
              case 0:
                pcVar63 = jas_tvparser_getval(tvp);
                iVar22 = atoi(pcVar63);
                pjVar25->debug = iVar22;
                break;
              case 1:
                pcVar63 = jas_tvparser_getval(tvp);
                iVar22 = atoi(pcVar63);
                uVar27 = (uint_fast32_t)iVar22;
                puVar52 = puVar37;
                goto LAB_0011ebc4;
              case 2:
                pcVar63 = jas_tvparser_getval(tvp);
                iVar22 = atoi(pcVar63);
                pjVar25->imgareatly = (long)iVar22;
                break;
              case 3:
                pcVar63 = jas_tvparser_getval(tvp);
                iVar22 = atoi(pcVar63);
                uVar27 = (uint_fast32_t)iVar22;
                puVar52 = puVar1;
                goto LAB_0011ebc4;
              case 4:
                pcVar63 = jas_tvparser_getval(tvp);
                iVar22 = atoi(pcVar63);
                pjVar25->tilegrdoffy = (long)iVar22;
                break;
              case 5:
                pcVar63 = jas_tvparser_getval(tvp);
                iVar22 = atoi(pcVar63);
                uVar27 = (uint_fast32_t)iVar22;
                puVar52 = puVar2;
LAB_0011ebc4:
                *puVar52 = uVar27;
                break;
              case 6:
                pcVar63 = jas_tvparser_getval(tvp);
                iVar22 = atoi(pcVar63);
                pjVar25->tileheight = (long)iVar22;
                break;
              case 7:
                pcVar63 = jas_tvparser_getval(tvp);
                iVar22 = atoi(pcVar63);
                iVar22 = jpc_floorlog2(iVar22);
                uVar75 = (ulong)iVar22;
                break;
              case 8:
                pcVar63 = jas_tvparser_getval(tvp);
                iVar22 = atoi(pcVar63);
                iVar22 = jpc_floorlog2(iVar22);
                uVar74 = (ulong)iVar22;
                break;
              case 9:
                pcVar63 = jas_tvparser_getval(tvp);
                iVar22 = atoi(pcVar63);
                iVar22 = jpc_floorlog2(iVar22);
                (pjVar25->tccp).cblkwidthexpn = (long)iVar22;
                break;
              case 10:
                pcVar63 = jas_tvparser_getval(tvp);
                iVar22 = atoi(pcVar63);
                iVar22 = jpc_floorlog2(iVar22);
                (pjVar25->tccp).cblkheightexpn = (long)iVar22;
                break;
              case 0xb:
                pcVar63 = jas_tvparser_getval(tvp);
                pjVar28 = jas_taginfos_lookup(modetab,pcVar63);
                pjVar28 = jas_taginfo_nonull(pjVar28);
                if (pjVar28->id < 0) {
                  pcVar67 = "ignoring invalid mode %s\n";
                  goto LAB_0011ecac;
                }
                (pjVar25->tcp).intmode = pjVar28->id == 0;
                break;
              case 0xc:
                pcVar63 = jas_tvparser_getval(tvp);
                pjVar28 = jas_taginfos_lookup(prgordtab,pcVar63);
                pjVar28 = jas_taginfo_nonull(pjVar28);
                if (pjVar28->id < 0) {
                  pcVar67 = "ignoring invalid progression order %s\n";
                  goto LAB_0011ecac;
                }
                (pjVar25->tcp).prg = (uint_fast8_t)pjVar28->id;
                break;
              case 0xd:
                bVar77 = false;
                break;
              case 0xe:
                pcVar63 = jas_tvparser_getval(tvp);
                iVar22 = atoi(pcVar63);
                (pjVar25->tccp).maxrlvls = (uint_fast8_t)iVar22;
                break;
              case 0xf:
                puVar3 = &(pjVar25->tcp).csty;
                *puVar3 = *puVar3 | 2;
                break;
              case 0x10:
                puVar3 = &(pjVar25->tcp).csty;
                *puVar3 = *puVar3 | 4;
                break;
              case 0x11:
                puVar3 = &(pjVar25->tccp).cblksty;
                *puVar3 = *puVar3 | 1;
                break;
              case 0x12:
                puVar3 = &(pjVar25->tccp).cblksty;
                *puVar3 = *puVar3 | 4;
                break;
              case 0x13:
                puVar3 = &(pjVar25->tccp).cblksty;
                *puVar3 = *puVar3 | 0x20;
                break;
              case 0x14:
                puVar3 = &(pjVar25->tccp).cblksty;
                *puVar3 = *puVar3 | 8;
                break;
              case 0x15:
                puVar3 = &(pjVar25->tccp).cblksty;
                *puVar3 = *puVar3 | 2;
                break;
              case 0x16:
                puVar3 = &(pjVar25->tccp).cblksty;
                *puVar3 = *puVar3 | 0x10;
                break;
              case 0x17:
                pcVar63 = jas_tvparser_getval(tvp);
                iVar22 = atoi(pcVar63);
                (pjVar25->tccp).numgbits = (uint_fast8_t)iVar22;
                break;
              case 0x18:
                pcVar63 = jas_tvparser_getval(tvp);
                uVar27 = pjVar25->rawsize;
                pcVar67 = strchr(pcVar63,0x42);
                if (pcVar67 == (char *)0x0) {
                  dVar78 = atof(pcVar63);
                  if (0.0 <= dVar78) {
                    if (1.0 < dVar78) {
                      uVar27 = uVar27 + 1;
                      goto LAB_0011eb14;
                    }
                    auVar80._0_8_ = (double)CONCAT44(0x43300000,(int)uVar27);
                    auVar80._8_4_ = (int)(uVar27 >> 0x20);
                    auVar80._12_4_ = 0x45300000;
                    dVar78 = dVar78 * ((auVar80._8_8_ - 1.9342813113834067e+25) +
                                      (auVar80._0_8_ - 4503599627370496.0));
                    uVar71 = (ulong)dVar78;
                    pjVar25->totalsize =
                         (long)(dVar78 - 9.223372036854776e+18) & (long)uVar71 >> 0x3f | uVar71;
                  }
                  else {
                    pjVar25->totalsize = 0;
                  }
                }
                else {
                  iVar22 = atoi(pcVar63);
                  uVar27 = (uint_fast32_t)iVar22;
LAB_0011eb14:
                  pjVar25->totalsize = uVar27;
                }
                break;
              case 0x19:
                pcVar63 = jas_tvparser_getval(tvp);
                iVar22 = jpc_atoaf(pcVar63,(int *)local_16f8,(double **)local_12f8);
                if (iVar22 != 0) {
                  pcVar63 = jas_tvparser_getval(tvp);
                  pcVar67 = "warning: invalid intermediate layer rates specifier ignored (%s)\n";
                  goto LAB_0011ecac;
                }
                break;
              case 0x1a:
                pcVar63 = jas_tvparser_getval(tvp);
                iVar22 = atoi(pcVar63);
                local_1778 = (ulong)iVar22;
                break;
              default:
                pcVar67 = "warning: ignoring invalid option %s\n";
LAB_0011ecac:
                jas_eprintf(pcVar67,pcVar63);
              }
              iVar22 = jas_tvparser_next(tvp);
            } while (iVar22 == 0);
          }
          else {
            bVar77 = true;
            uVar75 = 0xf;
            local_1778 = 0;
            uVar74 = 0xf;
          }
          jas_tvparser_destroy(tvp);
          uVar71 = pjVar25->totalsize;
          if (uVar71 != 0xffffffffffffffff) {
            uVar27 = 0;
            if (local_1778 <= uVar71) {
              uVar27 = uVar71 - local_1778;
            }
            pjVar25->totalsize = uVar27;
          }
          if (*puVar37 == 0xffffffffffffffff) {
            uVar27 = 0;
          }
          else {
            if (local_1738 != 1) {
              jas_eprintf("warning: overriding imgareatlx value\n");
            }
            uVar27 = local_1738 * *puVar37;
          }
          pjVar25->imgareatlx = uVar27;
          if (pjVar25->imgareatly == 0xffffffffffffffff) {
            uVar27 = 0;
          }
          else {
            if (lVar76 != 1) {
              jas_eprintf("warning: overriding imgareatly value\n");
            }
            uVar27 = lVar76 * pjVar25->imgareatly;
          }
          pjVar25->imgareatly = uVar27;
          uVar53 = (image->brx_ - image->tlx_) + pjVar25->imgareatlx;
          pjVar25->refgrdwidth = uVar53;
          uVar29 = (image->bry_ - image->tly_) + uVar27;
          pjVar25->refgrdheight = uVar29;
          if (pjVar25->tilegrdoffx == 0xffffffffffffffff) {
            *puVar1 = pjVar25->imgareatlx;
          }
          if (pjVar25->tilegrdoffy == 0xffffffffffffffff) {
            pjVar25->tilegrdoffy = uVar27;
          }
          if (*puVar2 == 0) {
            *puVar2 = uVar53 - *puVar1;
          }
          if (pjVar25->tileheight == 0) {
            pjVar25->tileheight = uVar29 - pjVar25->tilegrdoffy;
          }
          if (pjVar25->numcmpts == 3) {
            if ((ulong)image->numcmpts_ == 0) {
              if (bVar77) goto LAB_0011eecd;
              goto LAB_0011ef09;
            }
            pjVar8 = *image->cmpts_;
            bVar49 = 1;
            uVar71 = 0;
            do {
              pjVar9 = image->cmpts_[uVar71];
              if ((((pjVar9->prec_ != pjVar8->prec_) || (pjVar9->sgnd_ != pjVar8->sgnd_)) ||
                  (pjVar9->width_ != pjVar8->width_)) || (pjVar9->height_ != pjVar8->height_)) {
                bVar49 = 0;
              }
              uVar71 = uVar71 + 1;
            } while (image->numcmpts_ != uVar71);
            if (!(bool)(bVar49 & bVar77)) goto LAB_0011ef09;
LAB_0011eecd:
            if ((image->clrspc_ & 0xffffff00U) != 0x400) {
              jas_eprintf("warning: color space apparently not RGB\n");
            }
            if ((!bVar77) || ((image->clrspc_ & 0xffffff00U) != 0x400)) goto LAB_0011ef09;
            uVar21 = (pjVar25->tcp).intmode + '\x01';
          }
          else {
LAB_0011ef09:
            uVar21 = '\0';
          }
          (pjVar25->tcp).mctid = uVar21;
          (pjVar25->tccp).qmfbid = (pjVar25->tcp).intmode;
          uVar71 = (ulong)(pjVar25->tccp).maxrlvls;
          if (uVar71 != 0) {
            uVar54 = 0;
            do {
              (pjVar25->tccp).prcwidthexpns[uVar54] = uVar75;
              (pjVar25->tccp).prcheightexpns[uVar54] = uVar74;
              uVar54 = uVar54 + 1;
            } while (uVar71 != uVar54);
          }
          if ((uVar75 != 0xf) || (uVar74 != 0xf)) {
            (pjVar25->tccp).csty = (pjVar25->tccp).csty | 1;
          }
          uVar71 = *puVar2;
          if (uVar71 == 0) {
            pcVar63 = "invalid tile width %lu\n";
          }
          else {
            uVar54 = pjVar25->tileheight;
            if (uVar54 != 0) {
              uVar41 = *puVar1;
              if (uVar41 <= *puVar37) {
                uVar66 = pjVar25->tilegrdoffy;
                if (((pjVar25->imgareatly <= uVar66 + uVar54) && (*puVar37 <= uVar41 + uVar71)) &&
                   (uVar66 <= pjVar25->imgareatly)) {
                  uVar71 = (~uVar41 + uVar71 + pjVar25->refgrdwidth) / uVar71;
                  pjVar25->numhtiles = uVar71;
                  uVar54 = (~uVar66 + uVar54 + pjVar25->refgrdheight) / uVar54;
                  pjVar25->numvtiles = uVar54;
                  pjVar25->numtiles = uVar54 * uVar71;
                  if (0 < (int)local_16f8[0] && (void *)local_12f8[0]._0_8_ != (void *)0x0) {
                    (pjVar25->tcp).numlyrs = (ulong)local_16f8[0] + 1;
                    pjVar35 = (jpc_fix_t *)jas_alloc2((ulong)local_16f8[0],8);
                    (pjVar25->tcp).ilyrrates = pjVar35;
                    if (pjVar35 == (jpc_fix_t *)0x0) goto LAB_0011efa7;
                    if (0 < (int)(pjVar25->tcp).numlyrs + -1) {
                      lVar76 = 0;
                      do {
                        pjVar35[lVar76] =
                             (long)(*(double *)(local_12f8[0]._0_8_ + lVar76 * 8) * 8192.0);
                        lVar76 = lVar76 + 1;
                      } while (lVar76 < (int)(pjVar25->tcp).numlyrs + -1);
                    }
                  }
                  uVar71 = pjVar25->totalsize;
                  if ((uVar71 == 0xffffffffffffffff) && ((pjVar25->tcp).intmode == false)) {
                    pcVar63 = "cannot use real mode for lossless coding\n";
                  }
                  else if (uVar75 < 0x10) {
                    if (uVar74 < 0x10) {
                      uVar55 = (pjVar25->tccp).cblkwidthexpn;
                      if (uVar55 - 0xd < 0xfffffffffffffff5) {
                        bVar49 = (byte)uVar55;
                        pcVar63 = "invalid code block width %d\n";
                      }
                      else {
                        uVar10 = (pjVar25->tccp).cblkheightexpn;
                        if (0xfffffffffffffff4 < uVar10 - 0xd) {
                          if (uVar10 + uVar55 < 0xd) {
                            if ((pjVar25->tcp).numlyrs < 0x4001) {
                              if ((pjVar25->tccp).maxrlvls != '\0') {
                                if ((pjVar25->tccp).numgbits < 9) {
                                  if ((uVar71 != 0xffffffffffffffff) && (pjVar25->rawsize < uVar71))
                                  {
                                    jas_eprintf(
                                               "warning: specified rate is unreasonably large (%lu > %lu)\n"
                                               );
                                  }
                                  uVar74 = (pjVar25->tcp).numlyrs;
                                  if (uVar74 < 2) goto LAB_001213d0;
                                  lVar76 = 0;
                                  do {
                                    if (uVar74 - 2 == lVar76) {
                                      uVar27 = pjVar25->totalsize;
                                      if ((uVar27 == 0xffffffffffffffff) || (uVar74 == 1))
                                      goto LAB_001213d0;
                                      auVar85._8_4_ = (int)(uVar27 >> 0x20);
                                      auVar85._0_8_ = uVar27;
                                      auVar85._12_4_ = 0x45300000;
                                      uVar29 = pjVar25->rawsize;
                                      auVar86._8_4_ = (int)(uVar29 >> 0x20);
                                      auVar86._0_8_ = uVar29;
                                      auVar86._12_4_ = 0x45300000;
                                      lVar76 = 0;
                                      goto LAB_001213b5;
                                    }
                                    pjVar35 = (pjVar25->tcp).ilyrrates;
                                    plVar5 = pjVar35 + lVar76;
                                    lVar68 = lVar76 + 1;
                                    lVar76 = lVar76 + 1;
                                  } while (*plVar5 < pjVar35[lVar68]);
                                  jas_eprintf(
                                             "intermediate layer rates must increase monotonically\n"
                                             );
                                }
                                else {
                                  pcVar63 = "invalid number of guard bits\n";
LAB_00121252:
                                  jas_eprintf(pcVar63);
                                }
                                goto LAB_0011efa7;
                              }
                              pcVar63 = "must be at least one resolution level\n";
                            }
                            else {
                              pcVar63 = "too many layers\n";
                            }
                          }
                          else {
                            pcVar63 = "code block size too large\n";
                          }
                          goto LAB_0011f657;
                        }
                        bVar49 = (byte)uVar10;
                        pcVar63 = "invalid code block height %d\n";
                      }
                      jas_eprintf(pcVar63,(ulong)(uint)(1 << (bVar49 & 0x1f)));
                      goto LAB_0011efa7;
                    }
                    pcVar63 = "invalid precinct height\n";
                  }
                  else {
                    pcVar63 = "invalid precinct width\n";
                  }
LAB_0011f657:
                  jas_eprintf(pcVar63);
                  goto LAB_0011efa7;
                }
              }
              jas_eprintf("invalid tile grid offset (%lu, %lu)\n",uVar41,pjVar25->tilegrdoffy);
              goto LAB_0011efa7;
            }
            pcVar63 = "invalid tile height %lu\n";
          }
          jas_eprintf(pcVar63,0);
        }
      }
    }
  }
LAB_0011efa7:
  if ((void *)local_12f8[0]._0_8_ != (void *)0x0) {
    jas_free((void *)local_12f8[0]._0_8_);
  }
  if (pjVar25 != (jpc_enc_cp_t *)0x0) {
    jpc_enc_cp_destroy(pjVar25);
  }
  pjVar25 = (jpc_enc_cp_t *)0x0;
  goto LAB_0011efc8;
  while (lVar76 = lVar76 + 1, uVar74 - 1 != lVar76) {
LAB_001213b5:
    if (((auVar85._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar27) - 4503599627370496.0)) /
        ((auVar86._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar29) - 4503599627370496.0)) <
        (double)(pjVar25->tcp).ilyrrates[lVar76] * 0.0001220703125) {
      pcVar63 = "warning: intermediate layer rates must be less than overall rate\n";
      goto LAB_00121252;
    }
  }
LAB_001213d0:
  if ((void *)local_12f8[0]._0_8_ != (void *)0x0) {
    jas_free((void *)local_12f8[0]._0_8_);
  }
LAB_0011efc8:
  if (pjVar25 == (jpc_enc_cp_t *)0x0) {
    pcVar63 = "invalid JP encoder options\n";
    enc = (jpc_enc_t *)0x0;
  }
  else {
    enc = (jpc_enc_t *)jas_malloc(0x48);
    if (enc == (jpc_enc_t *)0x0) {
LAB_0011f02d:
      enc = (jpc_enc_t *)0x0;
    }
    else {
      enc->image = image;
      enc->out = out;
      enc->cp = pjVar25;
      enc->curtile = (jpc_enc_tile_t *)0x0;
      enc->cstate = (jpc_cstate_t *)0x0;
      enc->mrk = (jpc_ms_t *)0x0;
      enc->tmpstream = (jas_stream_t *)0x0;
      pjVar30 = jpc_cstate_create();
      enc->cstate = pjVar30;
      if (pjVar30 == (jpc_cstate_t *)0x0) {
        jpc_enc_destroy(enc);
        goto LAB_0011f02d;
      }
      enc->len = 0;
      enc->mainbodysize = 0;
    }
    if (enc == (jpc_enc_t *)0x0) {
      pcVar63 = "jpc_enc_create failed\n";
      enc = (jpc_enc_t *)0x0;
      goto LAB_0011f097;
    }
    pjVar25 = enc->cp;
    lVar76 = enc->out->rwcnt_;
    pjVar31 = jpc_ms_create(0xff4f);
    enc->mrk = pjVar31;
    if (pjVar31 == (jpc_ms_t *)0x0) {
      pcVar63 = "cannot create SOC marker\n";
    }
    else {
      iVar22 = jpc_putms(enc->out,enc->cstate,pjVar31);
      if (iVar22 == 0) {
        jpc_ms_destroy(enc->mrk);
        enc->mrk = (jpc_ms_t *)0x0;
        pjVar31 = jpc_ms_create(0xff51);
        enc->mrk = pjVar31;
        if (pjVar31 == (jpc_ms_t *)0x0) {
          pcVar63 = "cannot create SIZ marker\n";
        }
        else {
          (pjVar31->parms).sot.tileno = 0;
          (pjVar31->parms).siz.xoff = pjVar25->imgareatlx;
          (pjVar31->parms).siz.yoff = pjVar25->imgareatly;
          (pjVar31->parms).sot.len = pjVar25->refgrdwidth;
          (pjVar31->parms).siz.height = pjVar25->refgrdheight;
          (pjVar31->parms).siz.tilexoff = pjVar25->tilegrdoffx;
          (pjVar31->parms).siz.tileyoff = pjVar25->tilegrdoffy;
          (pjVar31->parms).siz.tilewidth = pjVar25->tilewidth;
          (pjVar31->parms).siz.tileheight = pjVar25->tileheight;
          num_elements = pjVar25->numcmpts;
          (pjVar31->parms).siz.numcomps = num_elements;
          pjVar32 = (jpc_sizcomp_t *)jas_alloc2(num_elements,4);
          (pjVar31->parms).siz.comps = pjVar32;
          if (pjVar32 == (jpc_sizcomp_t *)0x0) {
            __assert_fail("siz->comps",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                          ,0x3a5,"int jpc_enc_encodemainhdr(jpc_enc_t *)");
          }
          uVar24 = (uint)pjVar25->numcmpts;
          if (0 < (int)uVar24) {
            p_Var60 = &pjVar25->ccps->sgnd;
            uVar74 = 0;
            do {
              pjVar32[uVar74].prec = p_Var60[-1];
              pjVar32[uVar74].sgnd = *p_Var60;
              pjVar32[uVar74].hsamp = ((jpc_enc_ccp_t *)(p_Var60 + -5))->sampgrdstepx;
              pjVar32[uVar74].vsamp = p_Var60[-4];
              uVar74 = uVar74 + 1;
              p_Var60 = p_Var60 + 0x330;
            } while ((uVar24 & 0x7fffffff) != uVar74);
          }
          iVar22 = jpc_putms(enc->out,enc->cstate,enc->mrk);
          if (iVar22 == 0) {
            jpc_ms_destroy(enc->mrk);
            enc->mrk = (jpc_ms_t *)0x0;
            pjVar31 = jpc_ms_create(0xff64);
            enc->mrk = pjVar31;
            if (pjVar31 == (jpc_ms_t *)0x0) {
              pcVar63 = "cannot create COM marker\n";
            }
            else {
              pcVar63 = jas_getversion();
              sprintf((char *)local_16f8,"Creator: JasPer Version %s",pcVar63);
              pjVar31 = enc->mrk;
              sVar33 = strlen((char *)local_16f8);
              (pjVar31->parms).sot.len = sVar33;
              (pjVar31->parms).sot.tileno = 1;
              puVar34 = (uchar *)jas_strdup((char *)local_16f8);
              (pjVar31->parms).ppm.data = puVar34;
              if (puVar34 == (uchar *)0x0) {
LAB_001214b9:
                abort();
              }
              iVar22 = jpc_putms(enc->out,enc->cstate,enc->mrk);
              if (iVar22 == 0) {
                jpc_ms_destroy(enc->mrk);
                enc->mrk = (jpc_ms_t *)0x0;
                if (pjVar25->numcmpts != 0) {
                  local_1750 = (jpc_enc_cblk_t *)0x10;
                  local_1770 = (jpc_enc_tcmpt_t *)0x0;
                  do {
                    pjVar36 = jpc_cod_gettsfb((uint)(pjVar25->tccp).qmfbid,
                                              (pjVar25->tccp).maxrlvls - 1);
                    uVar27 = (uint_fast32_t)(1 << ((pjVar25->tccp).maxrlvls & 0x1f));
                    jpc_tsfb_getbands(pjVar36,0,0,uVar27,uVar27,local_12f8);
                    jpc_tsfb_destroy(pjVar36);
                    bVar49 = (pjVar25->tccp).maxrlvls;
                    uVar55 = (ulong)bVar49 * 3 - 2;
                    if (uVar55 != 0) {
                      bVar48 = (pjVar25->tccp).qmfbid;
                      _Var6 = (pjVar25->tcp).intmode;
                      pjVar26 = pjVar25->ccps;
                      bVar7 = pjVar26[(long)local_1770].prec;
                      uVar74 = 0xffffffffffffffff;
                      pjVar35 = &local_12f8[0].synenergywt;
                      do {
                        if (uVar74 == 0xffffffffffffffff) {
                          iVar22 = 0;
                        }
                        else {
                          iVar22 = (int)(uVar74 / 3) + 1;
                        }
                        iVar22 = JPC_NOMINALGAIN((uint)bVar48,(uint)bVar49,iVar22,
                                                 *(int *)(pjVar35 + -3));
                        lVar68 = 0x2000;
                        if (_Var6 == false) {
                          lVar68 = ((long)(0x2000 << ((char)iVar22 + 1U & 0x1f)) << 0xd) / *pjVar35;
                        }
                        uVar27 = jpc_abstorelstepsize(lVar68,iVar22 + (uint)bVar7);
                        if (uVar27 == 0xffffffffffffffff) goto LAB_0011f08e;
                        *(uint_fast32_t *)
                         ((long)pjVar26->stepsizes + uVar74 * 8 + (long)local_1750 + -8) = uVar27;
                        lVar68 = uVar74 + (ulong)bVar49 * -3;
                        uVar74 = uVar74 + 1;
                        pjVar35 = pjVar35 + 6;
                      } while (lVar68 != -4);
                    }
                    pjVar25->ccps[(long)local_1770].numstepsizes = uVar55;
                    local_1770 = (jpc_enc_tcmpt_t *)((long)local_1770 + 1);
                    local_1750 = (jpc_enc_cblk_t *)((long)local_1750 + 0x330);
                  } while (local_1770 < pjVar25->numcmpts);
                }
                pjVar31 = jpc_ms_create(0xff52);
                enc->mrk = pjVar31;
                if (pjVar31 == (jpc_ms_t *)0x0) {
                  pcVar63 = "cannot create COD marker\n";
                }
                else {
                  bVar49 = (pjVar25->tccp).csty;
                  bVar48 = (pjVar25->tcp).csty | bVar49;
                  (pjVar31->parms).cod.csty = bVar48;
                  (pjVar31->parms).cod.compparms.csty = bVar48;
                  bVar48 = (pjVar25->tccp).maxrlvls;
                  (pjVar31->parms).cod.compparms.numdlvls = bVar48 - 1;
                  *(uint *)((long)&pjVar31->parms + 0x1c) = (uint)bVar48;
                  (pjVar31->parms).cod.prg = (pjVar25->tcp).prg;
                  (pjVar31->parms).sot.len = (pjVar25->tcp).numlyrs;
                  (pjVar31->parms).cod.compparms.cblkwidthval =
                       (char)(pjVar25->tccp).cblkwidthexpn + 0xfe;
                  (pjVar31->parms).cod.compparms.cblkheightval =
                       (char)(pjVar25->tccp).cblkheightexpn + 0xfe;
                  (pjVar31->parms).cod.compparms.cblksty = (pjVar25->tccp).cblksty;
                  (pjVar31->parms).cod.compparms.qmfbid = (pjVar25->tccp).qmfbid;
                  (pjVar31->parms).sot.partno = (pjVar25->tcp).mctid != '\0';
                  if (((bVar49 & 1) != 0) && ((ulong)bVar48 != 0)) {
                    uVar74 = 0;
                    do {
                      *(char *)((long)&pjVar31->parms + uVar74 * 2 + 0x20) =
                           (char)(pjVar25->tccp).prcwidthexpns[uVar74];
                      *(char *)((long)&pjVar31->parms + uVar74 * 2 + 0x21) =
                           (char)(pjVar25->tccp).prcheightexpns[uVar74];
                      uVar74 = uVar74 + 1;
                    } while (bVar48 != uVar74);
                  }
                  iVar22 = jpc_putms(enc->out,enc->cstate,pjVar31);
                  if (iVar22 == 0) {
                    jpc_ms_destroy(enc->mrk);
                    enc->mrk = (jpc_ms_t *)0x0;
                    pjVar31 = jpc_ms_create(0xff5c);
                    enc->mrk = pjVar31;
                    if (pjVar31 == (jpc_ms_t *)0x0) {
                      pcVar63 = "cannot create QCD marker\n";
                    }
                    else {
                      (pjVar31->parms).cod.csty = ((pjVar25->tccp).qmfbid == '\0') * '\x02';
                      pjVar26 = pjVar25->ccps;
                      *(int *)((long)&pjVar31->parms + 4) = (int)pjVar26->numstepsizes;
                      (pjVar31->parms).sot.partno = (pjVar25->tccp).numgbits;
                      (pjVar31->parms).poc.pchgs = (jpc_pocpchg_t *)pjVar26->stepsizes;
                      iVar22 = jpc_putms(enc->out,enc->cstate,pjVar31);
                      pcVar63 = "cannot write marker\n";
                      if (iVar22 == 0) {
                        (pjVar31->parms).sot.len = 0;
                        jpc_ms_destroy(enc->mrk);
                        enc->mrk = (jpc_ms_t *)0x0;
                        if (1 < pjVar25->numcmpts) {
                          uVar55 = 1;
                          lVar68 = 0x340;
                          do {
                            pjVar31 = jpc_ms_create(0xff5d);
                            enc->mrk = pjVar31;
                            if (pjVar31 == (jpc_ms_t *)0x0) {
                              pcVar63 = "cannot create QCC marker\n";
                              goto LAB_0011f084;
                            }
                            (pjVar31->parms).sot.tileno = uVar55;
                            (pjVar31->parms).coc.compparms.csty =
                                 ((pjVar25->tccp).qmfbid == '\0') * '\x02';
                            pjVar26 = pjVar25->ccps;
                            *(undefined4 *)((long)&pjVar31->parms + 0xc) =
                                 *(undefined4 *)((long)pjVar26->stepsizes + lVar68 + -0x18);
                            (pjVar31->parms).cod.compparms.cblksty = (pjVar25->tccp).numgbits;
                            (pjVar31->parms).ppm.data =
                                 (uchar *)((long)pjVar26->stepsizes + lVar68 + -0x10);
                            iVar22 = jpc_putms(enc->out,enc->cstate,pjVar31);
                            if (iVar22 != 0) goto LAB_0011f084;
                            (pjVar31->parms).siz.height = 0;
                            jpc_ms_destroy(enc->mrk);
                            enc->mrk = (jpc_ms_t *)0x0;
                            uVar55 = uVar55 + 1;
                            lVar68 = lVar68 + 0x330;
                          } while (uVar55 < pjVar25->numcmpts);
                        }
                        lVar76 = enc->out->rwcnt_ - lVar76;
                        enc->len = enc->len + lVar76;
                        uVar74 = enc->cp->totalsize;
                        uVar75 = lVar76 + 2;
                        uVar27 = 0;
                        if (uVar75 <= uVar74) {
                          uVar27 = uVar74 - uVar75;
                        }
                        if (uVar74 == 0xffffffffffffffff) {
                          uVar27 = 0xffffffffffffffff;
                        }
                        enc->mainbodysize = uVar27;
                        local_1748 = enc->cp;
                        if (0 < (int)local_1748->numtiles) {
                          local_1718 = 0;
                          do {
                            image_00 = enc->image;
                            pjVar25 = enc->cp;
                            tile_00 = (jpc_enc_tile_t *)jas_malloc(0x68);
                            if (tile_00 == (jpc_enc_tile_t *)0x0) {
LAB_00120550:
                              local_1770 = (jpc_enc_tcmpt_t *)0x0;
                            }
                            else {
                              tile_00->tcmpts = (jpc_enc_tcmpt_t *)0x0;
                              tile_00->lyrsizes = (uint_fast32_t *)0x0;
                              tile_00->numtcmpts = (uint)pjVar25->numcmpts;
                              tile_00->pi = (jpc_pi_t *)0x0;
                              tile_00->tileno = local_1718;
                              uVar75 = local_1718 / pjVar25->numhtiles;
                              uVar71 = local_1718 % pjVar25->numhtiles;
                              uVar27 = pjVar25->tilegrdoffx;
                              uVar29 = pjVar25->tilewidth;
                              uVar74 = uVar29 * uVar71 + uVar27;
                              if (uVar74 <= pjVar25->imgareatlx) {
                                uVar74 = pjVar25->imgareatlx;
                              }
                              tile_00->tlx = uVar74;
                              uVar53 = pjVar25->tilegrdoffy;
                              uVar11 = pjVar25->tileheight;
                              uVar74 = uVar11 * uVar75 + uVar53;
                              if (uVar74 <= pjVar25->imgareatly) {
                                uVar74 = pjVar25->imgareatly;
                              }
                              tile_00->tly = uVar74;
                              uVar74 = (uVar71 + 1) * uVar29 + uVar27;
                              if (pjVar25->refgrdwidth <= uVar74) {
                                uVar74 = pjVar25->refgrdwidth;
                              }
                              tile_00->brx = uVar74;
                              uVar74 = (uVar75 + 1) * uVar11 + uVar53;
                              if (pjVar25->refgrdheight <= uVar74) {
                                uVar74 = pjVar25->refgrdheight;
                              }
                              tile_00->bry = uVar74;
                              tile_00->intmode = (pjVar25->tcp).intmode;
                              tile_00->csty = (pjVar25->tcp).csty;
                              tile_00->prg = (pjVar25->tcp).prg;
                              tile_00->mctid = (pjVar25->tcp).mctid;
                              uVar74 = (pjVar25->tcp).numlyrs;
                              tile_00->numlyrs = (uint)uVar74;
                              puVar37 = (uint_fast32_t *)jas_alloc2(uVar74 & 0xffffffff,8);
                              tile_00->lyrsizes = puVar37;
                              if (puVar37 == (uint_fast32_t *)0x0) {
LAB_00120546:
                                jpc_enc_tile_destroy(tile_00);
                                goto LAB_00120550;
                              }
                              if ((ulong)tile_00->numlyrs != 0) {
                                memset(puVar37,0,(ulong)tile_00->numlyrs << 3);
                              }
                              local_1770 = (jpc_enc_tcmpt_t *)jas_alloc2(pjVar25->numcmpts,0x478);
                              tile_00->tcmpts = local_1770;
                              if (local_1770 == (jpc_enc_tcmpt_t *)0x0) goto LAB_00120546;
                              uVar55 = pjVar25->numcmpts;
                              if (uVar55 != 0) {
                                ppjVar56 = &local_1770->tsfb;
                                do {
                                  *ppjVar56 = (jpc_tsfb_t *)0x0;
                                  ppjVar56[-3] = (jpc_tsfb_t *)0x0;
                                  ppjVar56[-2] = (jpc_tsfb_t *)0x0;
                                  ppjVar56 = ppjVar56 + 0x8f;
                                  uVar55 = uVar55 - 1;
                                } while (uVar55 != 0);
                              }
                              uVar55 = pjVar25->numcmpts;
                              if (uVar55 != 0) {
                                local_1708 = 0;
                                do {
                                  local_1770->tile = tile_00;
                                  local_1770->tsfb = (jpc_tsfb_t *)0x0;
                                  local_1770->rlvls = (jpc_enc_rlvl_t *)0x0;
                                  local_1770->data = (jas_matrix_t *)0x0;
                                  lVar76 = (long)local_1770 - (long)tile_00->tcmpts >> 3;
                                  pjVar26 = pjVar25->ccps;
                                  uVar71 = (ulong)pjVar26[lVar76 * -0x1ca4b3055ee191].sampgrdstepx;
                                  uVar74 = (tile_00->tlx + (uVar71 - 1)) / uVar71;
                                  uVar54 = (ulong)pjVar26[lVar76 * -0x1ca4b3055ee191].sampgrdstepy;
                                  uVar75 = (tile_00->tly + (uVar54 - 1)) / uVar54;
                                  uVar71 = ((uVar71 - 1) + tile_00->brx) / uVar71;
                                  uVar54 = ((uVar54 - 1) + tile_00->bry) / uVar54;
                                  pjVar38 = jas_seq2d_create(uVar74,uVar75,uVar71,uVar54);
                                  local_1770->data = pjVar38;
                                  if ((pjVar38 == (jas_matrix_t *)0x0) ||
                                     (uVar41 = (ulong)pjVar26[lVar76 * -0x1ca4b3055ee191].
                                                      sampgrdstepx,
                                     uVar66 = (ulong)pjVar26[lVar76 * -0x1ca4b3055ee191].
                                                     sampgrdstepy,
                                     iVar22 = jas_image_readcmpt(image_00,(int)lVar76 * -0x55ee191,
                                                                 uVar74 - ((pjVar25->imgareatlx +
                                                                           uVar41) - 1) / uVar41,
                                                                 uVar75 - ((pjVar25->imgareatly +
                                                                           uVar66) - 1) / uVar66,
                                                                 uVar71 - uVar74,uVar54 - uVar75,
                                                                 pjVar38), iVar22 != 0)) {
LAB_0012053c:
                                    tcmpt_destroy(local_1770);
                                    goto LAB_00120546;
                                  }
                                  local_1770->synweight = 0;
                                  uVar24 = (uint)(pjVar25->tccp).qmfbid;
                                  local_1770->qmfbid = uVar24;
                                  bVar49 = (pjVar25->tccp).maxrlvls;
                                  local_1770->numrlvls = (uint)bVar49;
                                  local_1770->numbands = (uint)bVar49 + (uint)bVar49 * 2 + -2;
                                  pjVar36 = jpc_cod_gettsfb(uVar24,bVar49 - 1);
                                  local_1770->tsfb = pjVar36;
                                  if (pjVar36 == (jpc_tsfb_t *)0x0) goto LAB_0012053c;
                                  uVar24 = local_1770->numrlvls;
                                  if ((ulong)uVar24 != 0) {
                                    uVar74 = 0;
                                    do {
                                      local_1770->prcwidthexpns[uVar74] =
                                           (int)(pjVar25->tccp).prcwidthexpns[uVar74];
                                      local_1770->prcheightexpns[uVar74] =
                                           (int)(pjVar25->tccp).prcheightexpns[uVar74];
                                      uVar74 = uVar74 + 1;
                                    } while (uVar24 != uVar74);
                                  }
                                  local_1770->cblkwidthexpn = (int)(pjVar25->tccp).cblkwidthexpn;
                                  local_1770->cblkheightexpn = (int)(pjVar25->tccp).cblkheightexpn;
                                  local_1770->cblksty = (uint)(pjVar25->tccp).cblksty;
                                  local_1770->csty = (uint)(pjVar25->tccp).csty;
                                  iVar22 = local_1770->numbands;
                                  local_1770->numstepsizes = iVar22;
                                  if (100 < (long)iVar22) {
                                    __assert_fail("tcmpt->numstepsizes <= JPC_MAXBANDS",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                                                  ,0x82d,
                                                  "jpc_enc_tcmpt_t *tcmpt_create(jpc_enc_tcmpt_t *, jpc_enc_cp_t *, jas_image_t *, jpc_enc_tile_t *)"
                                                 );
                                  }
                                  memset(local_1770->stepsizes,0,(long)iVar22 << 3);
                                  pjVar38 = local_1770->data;
                                  jpc_tsfb_getbands(pjVar36,pjVar38->xstart_,pjVar38->ystart_,
                                                    pjVar38->xend_,pjVar38->yend_,local_12f8);
                                  local_1768 = (jpc_enc_rlvl_t *)
                                               jas_alloc2((ulong)local_1770->numrlvls,0x68);
                                  local_1770->rlvls = local_1768;
                                  if (local_1768 == (jpc_enc_rlvl_t *)0x0) goto LAB_0012053c;
                                  uVar24 = local_1770->numrlvls;
                                  uVar74 = (ulong)uVar24;
                                  if (uVar74 != 0) {
                                    lVar76 = 0;
                                    do {
                                      *(undefined8 *)((long)&local_1768->bands + lVar76) = 0;
                                      *(jpc_enc_tcmpt_t **)((long)&local_1768->tcmpt + lVar76) =
                                           local_1770;
                                      lVar76 = lVar76 + 0x68;
                                    } while (uVar74 * 0x68 - lVar76 != 0);
                                    if (uVar24 != 0) {
                                      local_1700 = 0;
                                      do {
                                        pjVar43 = local_1770->rlvls;
                                        lVar76 = (long)local_1768 - (long)pjVar43 >> 3;
                                        local_1768->bands = (jpc_enc_band_t *)0x0;
                                        local_1768->tcmpt = local_1770;
                                        pjVar38 = local_1770->data;
                                        bVar49 = ~((char)lVar76 * -0x3b) + (char)uVar74;
                                        lVar68 = (long)(1 << (bVar49 & 0x1f)) + -1;
                                        uVar71 = pjVar38->xstart_ + lVar68 >> (bVar49 & 0x3f);
                                        local_1768->tlx = uVar71;
                                        uVar54 = pjVar38->ystart_ + lVar68 >> (bVar49 & 0x3f);
                                        local_1768->tly = uVar54;
                                        uVar75 = pjVar38->xend_ + lVar68 >> (bVar49 & 0x3f);
                                        local_1768->brx = uVar75;
                                        uVar74 = lVar68 + pjVar38->yend_ >> (bVar49 & 0x3f);
                                        local_1768->bry = uVar74;
                                        if ((uVar71 < uVar75) && (uVar54 < uVar74)) {
                                          uVar24 = (uint)(pjVar43 != local_1768) * 2 + 1;
                                          local_1768->numbands = uVar24;
                                          uVar12 = *(undefined8 *)
                                                    ((long)pjVar25 +
                                                    lVar76 * 0x7627627627627628 + 0xa8);
                                          uVar51 = (uint)uVar12;
                                          local_1768->prcwidthexpn = uVar51;
                                          uVar13 = *(undefined8 *)
                                                    ((long)pjVar25 +
                                                    lVar76 * 0x7627627627627628 + 0x1b0);
                                          uVar23 = (uint)uVar13;
                                          local_1768->prcheightexpn = uVar23;
                                          if (pjVar43 == local_1768) {
                                            local_1768->cbgwidthexpn = uVar51;
                                            uVar50 = uVar23;
                                          }
                                          else {
                                            local_1768->cbgwidthexpn = uVar51 - 1;
                                            uVar50 = uVar23 - 1;
                                          }
                                          local_1768->cbgheightexpn = uVar50;
                                          uVar41 = (pjVar25->tccp).cblkwidthexpn;
                                          uVar66 = (ulong)local_1768->cbgwidthexpn;
                                          if (uVar41 < local_1768->cbgwidthexpn) {
                                            uVar66 = uVar41;
                                          }
                                          local_1768->cblkwidthexpn = uVar66;
                                          uVar41 = (pjVar25->tccp).cblkheightexpn;
                                          uVar66 = (ulong)uVar50;
                                          if (uVar41 < uVar50) {
                                            uVar66 = uVar41;
                                          }
                                          bVar49 = (byte)uVar12;
                                          iVar22 = -1 << (bVar49 & 0x1f);
                                          if ((int)uVar51 < 1) {
                                            iVar22 = -1;
                                          }
                                          bVar48 = (byte)uVar13;
                                          iVar73 = -1 << (bVar48 & 0x1f);
                                          if ((int)uVar23 < 1) {
                                            iVar73 = -1;
                                          }
                                          local_1768->cblkheightexpn = uVar66;
                                          if (0 < (int)uVar51) {
                                            iVar62 = 1 << (bVar49 & 0x1f);
                                            uVar75 = (long)-iVar62 & (uVar75 + (long)iVar62) - 1;
                                          }
                                          if (0 < (int)uVar23) {
                                            iVar62 = 1 << (bVar48 & 0x1f);
                                            uVar74 = (long)-iVar62 & (uVar74 + (long)iVar62) - 1;
                                          }
                                          iVar62 = (int)(uVar75 - (uVar71 & (long)iVar22) >>
                                                        (bVar49 & 0x3f));
                                          local_1768->numhprcs = iVar62;
                                          iVar22 = (int)(uVar74 - (uVar54 & (long)iVar73) >>
                                                        (bVar48 & 0x3f));
                                          local_1768->numvprcs = iVar22;
                                          local_1768->numprcs = iVar22 * iVar62;
                                          local_1740 = (jpc_enc_band_t *)
                                                       jas_alloc2((ulong)uVar24,0x40);
                                          local_1768->bands = local_1740;
                                          if (local_1740 == (jpc_enc_band_t *)0x0) {
LAB_00120532:
                                            rlvl_destroy(local_1768);
                                            goto LAB_0012053c;
                                          }
                                          uVar24 = local_1768->numbands;
                                          if ((ulong)uVar24 != 0) {
                                            lVar76 = 0;
                                            do {
                                              puVar4 = (undefined8 *)
                                                       ((long)&local_1740->prcs + lVar76);
                                              *puVar4 = 0;
                                              puVar4[1] = 0;
                                              *(jpc_enc_rlvl_t **)((long)&local_1740->rlvl + lVar76)
                                                   = local_1768;
                                              lVar76 = lVar76 + 0x40;
                                            } while ((ulong)uVar24 << 6 != lVar76);
                                          }
                                          if (local_1768->numbands != 0) {
                                            local_1710 = 0;
                                            do {
                                              pjVar14 = local_1768->tcmpt;
                                              local_1740->prcs = (jpc_enc_prc_t *)0x0;
                                              local_1740->data = (jas_matrix_t *)0x0;
                                              local_1740->rlvl = local_1768;
                                              lVar76 = (long)local_1768 - (long)pjVar14->rlvls >> 3;
                                              if (local_1768 == pjVar14->rlvls) {
                                                lVar68 = 0;
                                              }
                                              else {
                                                lVar68 = ((long)local_1740 - (long)local_1768->bands
                                                         >> 6) + lVar76 * -0x13b13b13b13b13b1 + -2;
                                              }
                                              if ((local_12f8[lVar68].xstart !=
                                                   local_12f8[lVar68].xend) &&
                                                 (local_12f8[lVar68].ystart !=
                                                  local_12f8[lVar68].yend)) {
                                                pjVar38 = jas_seq2d_create(0,0,0,0);
                                                local_1740->data = pjVar38;
                                                if ((pjVar38 != (jas_matrix_t *)0x0) &&
                                                   (iVar22 = jas_seq2d_bindsub(pjVar38,pjVar14->data
                                                                               ,(long)local_12f8
                                                                                      [lVar68].
                                                  locxstart,(long)local_12f8[lVar68].locystart,
                                                  (long)local_12f8[lVar68].locxend,
                                                  (long)local_12f8[lVar68].locyend), iVar22 == 0)) {
                                                  pjVar38 = local_1740->data;
                                                  lVar57 = (long)local_12f8[lVar68].xstart;
                                                  iVar22 = local_12f8[lVar68].ystart;
                                                  pjVar38->xstart_ = lVar57;
                                                  pjVar38->ystart_ = (long)iVar22;
                                                  pjVar38->xend_ = lVar57 + pjVar38->numcols_;
                                                  pjVar38->yend_ = (long)iVar22 + pjVar38->numrows_;
                                                  goto LAB_0011ff76;
                                                }
LAB_00120528:
                                                band_destroy(local_1740);
                                                goto LAB_00120532;
                                              }
LAB_0011ff76:
                                              iVar22 = local_12f8[lVar68].orient;
                                              local_1740->orient = iVar22;
                                              iVar22 = JPC_NOMINALGAIN((uint)(pjVar25->tccp).qmfbid,
                                                                       pjVar14->numrlvls,
                                                                       (int)lVar76 * -0x3b13b13b,
                                                                       iVar22);
                                              local_1740->analgain = iVar22;
                                              *(undefined8 *)&local_1740->numbps = 0;
                                              *(undefined8 *)((long)&local_1740->absstepsize + 4) =
                                                   0;
                                              local_1740->synweight = local_12f8[lVar68].synenergywt
                                              ;
                                              if (local_1740->data != (jas_matrix_t *)0x0) {
                                                pjVar39 = (jpc_enc_prc_t *)
                                                          jas_alloc2((ulong)local_1768->numprcs,0x60
                                                                    );
                                                local_1740->prcs = pjVar39;
                                                if (pjVar39 == (jpc_enc_prc_t *)0x0)
                                                goto LAB_00120528;
                                                uVar24 = local_1768->numprcs;
                                                if ((ulong)uVar24 != 0) {
                                                  lVar76 = 0;
                                                  do {
                                                    puVar4 = (undefined8 *)
                                                             ((long)&pjVar39->cblks + lVar76);
                                                    *puVar4 = 0;
                                                    puVar4[1] = 0;
                                                    *(undefined8 *)
                                                     ((long)&pjVar39->nlibtree + lVar76) = 0;
                                                    puVar4 = (undefined8 *)
                                                             ((long)&pjVar39->savincltree + lVar76);
                                                    *puVar4 = 0;
                                                    puVar4[1] = 0;
                                                    *(jpc_enc_band_t **)
                                                     ((long)&pjVar39->band + lVar76) = local_1740;
                                                    lVar76 = lVar76 + 0x60;
                                                  } while ((ulong)uVar24 * 0x60 != lVar76);
                                                }
                                                if (local_1768->numprcs != 0) {
                                                  local_1720 = 0;
                                                  do {
                                                    pjVar39->cblks = (jpc_enc_cblk_t *)0x0;
                                                    pjVar39->incltree = (jpc_tagtree_t *)0x0;
                                                    pjVar39->nlibtree = (jpc_tagtree_t *)0x0;
                                                    pjVar39->savincltree = (jpc_tagtree_t *)0x0;
                                                    pjVar39->savnlibtree = (jpc_tagtree_t *)0x0;
                                                    pjVar15 = local_1740->rlvl;
                                                    pjVar16 = local_1740->prcs;
                                                    iVar22 = pjVar15->numhprcs;
                                                    pjVar17 = pjVar15->tcmpt->rlvls;
                                                    pjVar39->band = local_1740;
                                                    iVar73 = -1 << ((byte)pjVar15->prcwidthexpn &
                                                                   0x1f);
                                                    if (pjVar15->prcwidthexpn < 1) {
                                                      iVar73 = -1;
                                                    }
                                                    uVar74 = (long)iVar73 & pjVar15->tlx;
                                                    iVar73 = -1 << ((byte)pjVar15->prcheightexpn &
                                                                   0x1f);
                                                    if (pjVar15->prcheightexpn < 1) {
                                                      iVar73 = -1;
                                                    }
                                                    uVar71 = (long)iVar73 & pjVar15->tly;
                                                    uVar75 = uVar74 + 1 >> 1;
                                                    if (pjVar15 == pjVar17) {
                                                      uVar75 = uVar74;
                                                    }
                                                    uVar74 = uVar71 + 1 >> 1;
                                                    if (pjVar15 == pjVar17) {
                                                      uVar74 = uVar71;
                                                    }
                                                    uVar71 = ((long)pjVar39 - (long)pjVar16 >> 5) *
                                                             -0x5555555555555555;
                                                    bVar49 = (byte)pjVar15->cbgwidthexpn;
                                                    bVar48 = (byte)pjVar15->cbgheightexpn;
                                                    uVar75 = (uVar71 % (ulong)(long)iVar22 <<
                                                             (bVar49 & 0x3f)) + uVar75;
                                                    uVar74 = (uVar71 / (ulong)(long)iVar22 <<
                                                             (bVar48 & 0x3f)) + uVar74;
                                                    pjVar38 = local_1740->data;
                                                    uVar71 = pjVar38->xstart_;
                                                    if (pjVar38->xstart_ <= (long)uVar75) {
                                                      uVar71 = uVar75;
                                                    }
                                                    pjVar39->tlx = uVar71;
                                                    uVar54 = pjVar38->ystart_;
                                                    if (pjVar38->ystart_ <= (long)uVar74) {
                                                      uVar54 = uVar74;
                                                    }
                                                    pjVar39->tly = uVar54;
                                                    uVar75 = (long)(1 << (bVar49 & 0x1f)) + uVar75;
                                                    if (pjVar38->xend_ < (long)uVar75) {
                                                      uVar75 = pjVar38->xend_;
                                                    }
                                                    pjVar39->brx = uVar75;
                                                    uVar74 = (long)(1 << (bVar48 & 0x1f)) + uVar74;
                                                    if (pjVar38->yend_ < (long)uVar74) {
                                                      uVar74 = pjVar38->yend_;
                                                    }
                                                    pjVar39->bry = uVar74;
                                                    if ((uVar71 < uVar75) && (uVar54 < uVar74)) {
                                                      bVar49 = (byte)pjVar15->cblkwidthexpn;
                                                      bVar48 = (byte)pjVar15->cblkheightexpn;
                                                      if (pjVar15->cblkwidthexpn != 0) {
                                                        iVar22 = 1 << (bVar49 & 0x1f);
                                                        uVar75 = (long)-iVar22 &
                                                                 (uVar75 + (long)iVar22) - 1;
                                                      }
                                                      if (pjVar15->cblkheightexpn != 0) {
                                                        iVar22 = 1 << (bVar48 & 0x1f);
                                                        uVar74 = (long)-iVar22 &
                                                                 (uVar74 + (long)iVar22) - 1;
                                                      }
                                                      iVar73 = (int)(uVar75 - (uVar71 & (long)(-1 <<
                                                                                              (
                                                  bVar49 & 0x1f))) >> (bVar49 & 0x3f));
                                                  pjVar39->numhcblks = iVar73;
                                                  iVar22 = (int)(uVar74 - (uVar54 & (long)(-1 << (
                                                  bVar48 & 0x1f))) >> (bVar48 & 0x3f));
                                                  pjVar39->numvcblks = iVar22;
                                                  pjVar39->numcblks = iVar22 * iVar73;
                                                  pjVar40 = jpc_tagtree_create(iVar73,iVar22);
                                                  pjVar39->incltree = pjVar40;
                                                  if (pjVar40 != (jpc_tagtree_t *)0x0) {
                                                    pjVar40 = jpc_tagtree_create(pjVar39->numhcblks,
                                                                                 pjVar39->numvcblks)
                                                    ;
                                                    pjVar39->nlibtree = pjVar40;
                                                    if (pjVar40 != (jpc_tagtree_t *)0x0) {
                                                      pjVar40 = jpc_tagtree_create(pjVar39->
                                                  numhcblks,pjVar39->numvcblks);
                                                  pjVar39->savincltree = pjVar40;
                                                  if (pjVar40 != (jpc_tagtree_t *)0x0) {
                                                    pjVar40 = jpc_tagtree_create(pjVar39->numhcblks,
                                                                                 pjVar39->numvcblks)
                                                    ;
                                                    pjVar39->savnlibtree = pjVar40;
                                                    if (pjVar40 != (jpc_tagtree_t *)0x0) {
                                                      cblk = (jpc_enc_cblk_t *)
                                                             jas_alloc2((ulong)pjVar39->numcblks,
                                                                        0x68);
                                                      pjVar39->cblks = cblk;
                                                      if (cblk != (jpc_enc_cblk_t *)0x0) {
                                                        uVar24 = pjVar39->numcblks;
                                                        if ((ulong)uVar24 != 0) {
                                                          lVar76 = 0;
                                                          do {
                                                            *(undefined8 *)
                                                             ((long)&cblk->passes + lVar76) = 0;
                                                            puVar4 = (undefined8 *)
                                                                     ((long)&cblk->stream + lVar76);
                                                            *puVar4 = 0;
                                                            puVar4[1] = 0;
                                                            puVar4 = (undefined8 *)
                                                                     ((long)&cblk->data + lVar76);
                                                            *puVar4 = 0;
                                                            puVar4[1] = 0;
                                                            *(jpc_enc_prc_t **)
                                                             ((long)&cblk->prc + lVar76) = pjVar39;
                                                            lVar76 = lVar76 + 0x68;
                                                          } while ((ulong)uVar24 * 0x68 - lVar76 !=
                                                                   0);
                                                        }
                                                        if (pjVar39->numcblks != 0) {
                                                          uVar74 = 0;
                                                          local_1750 = cblk;
                                                          do {
                                                            uVar54 = ((long)local_1750 -
                                                                      (long)pjVar39->cblks >> 3) *
                                                                     0x4ec4ec4ec4ec4ec5;
                                                            uVar41 = uVar54 / (ulong)(long)pjVar39->
                                                  numhcblks;
                                                  uVar54 = uVar54 % (ulong)(long)pjVar39->numhcblks;
                                                  pjVar18 = pjVar39->band;
                                                  pjVar15 = pjVar18->rlvl;
                                                  cblk->prc = pjVar39;
                                                  cblk->numpasses = 0;
                                                  cblk->curpass = (jpc_enc_pass_t *)0x0;
                                                  cblk->passes = (jpc_enc_pass_t *)0x0;
                                                  cblk->numencpasses = 0;
                                                  cblk->numimsbs = 0;
                                                  cblk->numlenbits = 0;
                                                  cblk->stream = (jas_stream_t *)0x0;
                                                  cblk->mqenc = (jpc_mqenc_t *)0x0;
                                                  cblk->data = (jas_matrix_t *)0x0;
                                                  cblk->flags = (jas_matrix_t *)0x0;
                                                  cblk->numbps = 0;
                                                  cblk->savedcurpass = (jpc_enc_pass_t *)0x0;
                                                  cblk->savednumlenbits = 0;
                                                  cblk->savednumencpasses = 0;
                                                  bVar49 = (byte)pjVar15->cblkwidthexpn;
                                                  bVar48 = (byte)pjVar15->cblkheightexpn;
                                                  uVar75 = pjVar39->tlx;
                                                  uVar71 = (long)(-1 << (bVar49 & 0x1f)) & uVar75;
                                                  local_1738 = (uVar54 << (bVar49 & 0x3f)) + uVar71;
                                                  if (local_1738 <= uVar75) {
                                                    local_1738 = uVar75;
                                                  }
                                                  uVar75 = pjVar39->tly;
                                                  uVar66 = (long)(-1 << (bVar48 & 0x1f)) & uVar75;
                                                  ystart = (uVar41 << (bVar48 & 0x3f)) + uVar66;
                                                  if (ystart <= uVar75) {
                                                    ystart = uVar75;
                                                  }
                                                  uVar71 = uVar71 + (uVar54 + 1 << (bVar49 & 0x3f));
                                                  if (pjVar39->brx <= uVar71) {
                                                    uVar71 = pjVar39->brx;
                                                  }
                                                  uVar66 = uVar66 + (uVar41 + 1 << (bVar48 & 0x3f));
                                                  if (pjVar39->bry <= uVar66) {
                                                    uVar66 = pjVar39->bry;
                                                  }
                                                  if ((uVar71 <= local_1738) || (uVar66 <= ystart))
                                                  {
                                                    __assert_fail(
                                                  "cblktlx < cblkbrx && cblktly < cblkbry",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                                                  ,0x9fd,
                                                  "jpc_enc_cblk_t *cblk_create(jpc_enc_cblk_t *, jpc_enc_prc_t *)"
                                                  );
                                                  }
                                                  pjVar38 = jas_seq2d_create(0,0,0,0);
                                                  cblk->data = pjVar38;
                                                  if ((pjVar38 == (jas_matrix_t *)0x0) ||
                                                     (iVar22 = jas_seq2d_bindsub(pjVar38,pjVar18->
                                                  data,local_1738,ystart,uVar71,uVar66), iVar22 != 0
                                                  )) {
                                                    cblk_destroy(cblk);
                                                    goto LAB_00120520;
                                                  }
                                                  uVar74 = uVar74 + 1;
                                                  cblk = cblk + 1;
                                                  local_1750 = local_1750 + 1;
                                                  } while (uVar74 < pjVar39->numcblks);
                                                  }
                                                  goto LAB_00120451;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
LAB_00120520:
                                                  prc_destroy(pjVar39);
                                                  goto LAB_00120528;
                                                  }
                                                  pjVar39->tlx = uVar75;
                                                  pjVar39->tly = uVar74;
                                                  pjVar39->numcblks = 0;
                                                  pjVar39->numhcblks = 0;
                                                  pjVar39->numvcblks = 0;
                                                  pjVar39->nlibtree = (jpc_tagtree_t *)0x0;
                                                  pjVar39->cblks = (jpc_enc_cblk_t *)0x0;
                                                  pjVar39->incltree = (jpc_tagtree_t *)0x0;
                                                  pjVar39->savincltree = (jpc_tagtree_t *)0x0;
                                                  pjVar39->savnlibtree = (jpc_tagtree_t *)0x0;
LAB_00120451:
                                                  local_1720 = local_1720 + 1;
                                                  pjVar39 = pjVar39 + 1;
                                                  } while (local_1720 < local_1768->numprcs);
                                                }
                                              }
                                              local_1710 = local_1710 + 1;
                                              local_1740 = local_1740 + 1;
                                            } while (local_1710 < local_1768->numbands);
                                          }
                                        }
                                        else {
                                          local_1768->numhprcs = 0;
                                          local_1768->numvprcs = 0;
                                          local_1768->numprcs = 0;
                                        }
                                        local_1700 = local_1700 + 1;
                                        local_1768 = local_1768 + 1;
                                        uVar74 = (ulong)local_1770->numrlvls;
                                      } while (local_1700 < uVar74);
                                    }
                                  }
                                  local_1708 = local_1708 + 1;
                                  local_1770 = local_1770 + 1;
                                  uVar55 = pjVar25->numcmpts;
                                } while (local_1708 < uVar55);
                              }
                              if (tile_00->mctid == '\x02') {
                                jVar42 = 0x1a88;
                                jVar58 = 0x1a88;
LAB_0012118c:
                                pjVar64 = tile_00->tcmpts;
                                pjVar64->synweight = 0x376c;
                                pjVar64[1].synweight = jVar42;
                                pjVar64[2].synweight = jVar58;
                              }
                              else {
                                if (tile_00->mctid == '\x01') {
                                  jVar58 = 0x3259;
                                  jVar42 = 0x39c3;
                                  goto LAB_0012118c;
                                }
                                if (uVar55 != 0) {
                                  pjVar35 = &tile_00->tcmpts->synweight;
                                  do {
                                    *pjVar35 = 0x2000;
                                    pjVar35 = pjVar35 + 0x8f;
                                    uVar55 = uVar55 - 1;
                                  } while (uVar55 != 0);
                                }
                              }
                              pjVar47 = jpc_enc_pi_create(pjVar25,tile_00);
                              tile_00->pi = pjVar47;
                              local_1770 = (jpc_enc_tcmpt_t *)tile_00;
                              if (pjVar47 == (jpc_pi_t *)0x0) goto LAB_00120546;
                            }
                            enc->curtile = (jpc_enc_tile_t *)local_1770;
                            if (local_1770 == (jpc_enc_tcmpt_t *)0x0) {
                              pcVar63 = "cannot create tile\n";
LAB_0012148c:
                              jas_eprintf(pcVar63);
LAB_00121279:
                              pjVar25 = (jpc_enc_cp_t *)0x0;
                              pcVar63 = "cannot encode main body\n";
                              goto LAB_0011f097;
                            }
                            iVar22 = jas_getdbglevel();
                            if ((9 < iVar22) && (*(uint *)((long)local_1770 + 0x50) != 0)) {
                              pjVar64 = *(jpc_enc_tcmpt_t **)((long)local_1770 + 0x58);
                              local_1750 = (jpc_enc_cblk_t *)0x0;
                              do {
                                jas_eprintf("  tcmpt %5d %5d %5d %5d\n",pjVar64->data->xstart_,
                                            pjVar64->data->ystart_);
                                if (pjVar64->numrlvls != 0) {
                                  pjVar43 = pjVar64->rlvls;
                                  uVar74 = 0;
                                  do {
                                    jas_eprintf("    rlvl %5d %5d %5d %5d\n",pjVar43->tlx,
                                                pjVar43->tly,pjVar43->brx);
                                    if (pjVar43->numbands != 0) {
                                      pjVar59 = pjVar43->bands;
                                      uVar75 = 0;
                                      do {
                                        pjVar38 = pjVar59->data;
                                        if ((pjVar38 != (jas_matrix_t *)0x0) &&
                                           (jas_eprintf("      band %5d %5d %5d %5d\n",
                                                        pjVar38->xstart_,pjVar38->ystart_,
                                                        pjVar38->xend_), pjVar43->numprcs != 0)) {
                                          pjVar39 = pjVar59->prcs;
                                          uVar71 = 0;
                                          do {
                                            jas_eprintf("        prc %5d %5d %5d %5d (%5d %5d)\n");
                                            if ((pjVar39->cblks != (jpc_enc_cblk_t *)0x0) &&
                                               (pjVar39->numcblks != 0)) {
                                              ppjVar65 = &pjVar39->cblks->data;
                                              uVar54 = 0;
                                              do {
                                                pjVar38 = *ppjVar65;
                                                jas_eprintf("         cblk %5d %5d %5d %5d\n",
                                                            pjVar38->xstart_,pjVar38->ystart_,
                                                            pjVar38->xend_);
                                                uVar54 = uVar54 + 1;
                                                ppjVar65 = ppjVar65 + 0xd;
                                              } while (uVar54 < pjVar39->numcblks);
                                            }
                                            uVar71 = uVar71 + 1;
                                            pjVar39 = pjVar39 + 1;
                                          } while (uVar71 < pjVar43->numprcs);
                                        }
                                        uVar75 = uVar75 + 1;
                                        pjVar59 = pjVar59 + 1;
                                      } while (uVar75 < pjVar43->numbands);
                                    }
                                    uVar74 = uVar74 + 1;
                                    pjVar43 = pjVar43 + 1;
                                  } while (uVar74 < pjVar64->numrlvls);
                                }
                                local_1750 = (jpc_enc_cblk_t *)((long)local_1750 + 1);
                                pjVar64 = pjVar64 + 1;
                              } while (local_1750 < (ulong)*(uint *)((long)local_1770 + 0x50));
                            }
                            pjVar64 = *(jpc_enc_tcmpt_t **)((long)local_1770 + 0x58);
                            uVar74 = (ulong)*(uint *)((long)local_1770 + 0x50);
                            if (uVar74 != 0) {
                              pjVar26 = local_1748->ccps;
                              uVar75 = 0;
                              pjVar69 = pjVar64;
                              do {
                                if ((pjVar26[uVar75].sgnd == false) &&
                                   (pjVar38 = pjVar69->data, 0 < pjVar38->numrows_)) {
                                  uVar21 = pjVar26[uVar75].prec;
                                  lVar76 = 0;
                                  do {
                                    if (0 < pjVar38->numcols_) {
                                      pjVar19 = pjVar38->rows_[lVar76];
                                      lVar68 = 0;
                                      do {
                                        pjVar19[lVar68] =
                                             pjVar19[lVar68] - (long)(1 << (uVar21 - 1 & 0x1f));
                                        lVar68 = lVar68 + 1;
                                      } while (lVar68 < pjVar38->numcols_);
                                    }
                                    lVar76 = lVar76 + 1;
                                  } while (lVar76 < pjVar38->numrows_);
                                }
                                uVar75 = uVar75 + 1;
                                pjVar69 = pjVar69 + 1;
                              } while (uVar75 != uVar74);
                            }
                            if ((*(_Bool *)((long)local_1770 + 0x40) == false) && (uVar74 != 0)) {
                              lVar76 = 0;
                              do {
                                jas_matrix_asl(*(jas_matrix_t **)
                                                ((long)pjVar64->prcwidthexpns + lVar76 + -0x20),0xd)
                                ;
                                lVar76 = lVar76 + 0x478;
                              } while (uVar74 * 0x478 - lVar76 != 0);
                            }
                            if (*(uint_fast8_t *)local_1770->prcwidthexpns == '\x01') {
                              if (enc->image->numcmpts_ != 3) {
                                __assert_fail("jas_image_numcmpts(enc->image) == 3",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                                              ,0x48d,"int jpc_enc_encodemainbody(jpc_enc_t *)");
                              }
                              pjVar64 = *(jpc_enc_tcmpt_t **)((long)local_1770 + 0x58);
                              jpc_ict(pjVar64->data,pjVar64[1].data,pjVar64[2].data);
                            }
                            else if (*(uint_fast8_t *)local_1770->prcwidthexpns == '\x02') {
                              if (enc->image->numcmpts_ != 3) {
                                __assert_fail("jas_image_numcmpts(enc->image) == 3",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                                              ,0x488,"int jpc_enc_encodemainbody(jpc_enc_t *)");
                              }
                              pjVar64 = *(jpc_enc_tcmpt_t **)((long)local_1770 + 0x58);
                              jpc_rct(pjVar64->data,pjVar64[1].data,pjVar64[2].data);
                            }
                            if (enc->image->numcmpts_ != 0) {
                              lVar76 = 0x20;
                              uVar74 = 0;
                              do {
                                jpc_tsfb_analyze(*(jpc_tsfb_t **)
                                                  ((long)(*(jpc_enc_tcmpt_t **)
                                                           ((long)local_1770 + 0x58))->prcwidthexpns
                                                  + lVar76 + -0x30),
                                                 *(jas_seq2d_t **)
                                                  ((long)(*(jpc_enc_tcmpt_t **)
                                                           ((long)local_1770 + 0x58))->prcwidthexpns
                                                  + lVar76 + -0x40));
                                uVar74 = uVar74 + 1;
                                lVar76 = lVar76 + 0x478;
                              } while (uVar74 < enc->image->numcmpts_);
                            }
                            if ((ulong)*(uint *)((long)local_1770 + 0x50) != 0) {
                              local_1730 = *(jpc_enc_tcmpt_t **)((long)local_1770 + 0x58);
                              pjVar64 = local_1730 + *(uint *)((long)local_1770 + 0x50);
                              local_1768 = (jpc_enc_rlvl_t *)0x0;
                              do {
                                uVar74 = 0;
                                memset(local_1730->stepsizes,0,800);
                                uVar24 = local_1730->numrlvls;
                                if (uVar24 != 0) {
                                  pjVar43 = local_1730->rlvls;
                                  uVar74 = 0;
                                  uVar51 = 0;
                                  iVar22 = 0;
                                  do {
                                    pjVar59 = pjVar43->bands;
                                    if (pjVar59 == (jpc_enc_band_t *)0x0) {
                                      iVar22 = iVar22 + (uint)(uVar51 != 0) * 2 + 1;
                                    }
                                    else if ((ulong)pjVar43->numbands != 0) {
                                      pjVar44 = pjVar59 + pjVar43->numbands;
                                      do {
                                        pjVar38 = pjVar59->data;
                                        if (pjVar38 == (jas_matrix_t *)0x0) {
                                          iVar22 = iVar22 + 1;
                                        }
                                        else {
                                          lVar76 = pjVar38->numrows_;
                                          if (lVar76 < 1) {
                                            lVar68 = 0;
                                          }
                                          else {
                                            lVar57 = 0;
                                            lVar68 = 0;
                                            do {
                                              if (0 < pjVar38->numcols_) {
                                                lVar72 = 0;
                                                do {
                                                  lVar20 = pjVar38->rows_[lVar57][lVar72];
                                                  lVar70 = -lVar20;
                                                  if (0 < lVar20) {
                                                    lVar70 = lVar20;
                                                  }
                                                  if (lVar70 <= lVar68) {
                                                    lVar70 = lVar68;
                                                  }
                                                  lVar68 = lVar70;
                                                  lVar72 = lVar72 + 1;
                                                } while (pjVar38->numcols_ != lVar72);
                                              }
                                              lVar57 = lVar57 + 1;
                                            } while (lVar57 != lVar76);
                                          }
                                          _Var6 = *(_Bool *)((long)local_1770 + 0x40);
                                          iVar62 = jpc_fix_firstone(lVar68);
                                          iVar73 = iVar62 + 1;
                                          if (_Var6 == false) {
                                            iVar73 = iVar62 + -0xc;
                                          }
                                          iVar62 = (uint)local_1748->ccps[(long)local_1768].prec +
                                                   pjVar59->analgain;
                                          uVar23 = (iVar73 - iVar62) + 1;
                                          uVar75 = (ulong)uVar23;
                                          if ((int)uVar23 <= (int)uVar74) {
                                            uVar75 = uVar74;
                                          }
                                          lVar68 = 0x2000;
                                          if (_Var6 == false) {
                                            lVar68 = ((long)(0x2000 <<
                                                            ((char)pjVar59->analgain + 1U & 0x1f))
                                                     << 0xd) / pjVar59->synweight;
                                          }
                                          pjVar59->absstepsize = lVar68;
                                          uVar27 = jpc_abstorelstepsize(lVar68,iVar62);
                                          if (uVar27 != 0xffffffffffffffff) {
                                            pjVar59->stepsize = (int)uVar27;
                                            pjVar59->numbps =
                                                 ((uint)(uVar27 >> 0xb) & 0x1fffff) +
                                                 (uint)(local_1748->tccp).numgbits + -1;
                                            if (((0 < lVar76) && (lVar68 != 0x2000)) &&
                                               (_Var6 == false)) {
                                              lVar76 = 0;
                                              do {
                                                if (0 < pjVar38->numcols_) {
                                                  pjVar19 = pjVar38->rows_[lVar76];
                                                  lVar57 = 0;
                                                  do {
                                                    lVar72 = pjVar19[lVar57];
                                                    if (lVar72 < 0) {
                                                      jVar45 = -((lVar72 * -0x2000) / lVar68);
                                                    }
                                                    else {
                                                      jVar45 = (lVar72 << 0xd) / lVar68;
                                                    }
                                                    pjVar19[lVar57] = jVar45;
                                                    lVar57 = lVar57 + 1;
                                                  } while (lVar57 < pjVar38->numcols_);
                                                }
                                                lVar76 = lVar76 + 1;
                                              } while (lVar76 < pjVar38->numrows_);
                                            }
                                            local_1730->stepsizes[iVar22] = uVar27;
                                            iVar22 = iVar22 + 1;
                                          }
                                          uVar74 = uVar75;
                                          if (uVar27 == 0xffffffffffffffff) goto LAB_00121279;
                                        }
                                        pjVar59 = pjVar59 + 1;
                                      } while (pjVar59 != pjVar44);
                                    }
                                    uVar51 = uVar51 + 1;
                                    pjVar43 = pjVar43 + 1;
                                  } while (uVar51 != uVar24);
                                }
                                if (*(_Bool *)((long)local_1770 + 0x40) == false) {
                                  jas_matrix_divpow2(local_1730->data,7);
                                }
                                else {
                                  jas_matrix_asl(local_1730->data,6);
                                }
                                if ((int)(uint)(local_1748->tccp).numgbits < (int)uVar74) {
                                  jas_eprintf("error: too few guard bits (need at least %d)\n",
                                              uVar74);
                                  goto LAB_00121279;
                                }
                                local_1768 = (jpc_enc_rlvl_t *)((long)local_1768 + 1);
                                local_1730 = local_1730 + 1;
                              } while (local_1730 != pjVar64);
                            }
                            pjVar46 = jas_stream_memopen((char *)0x0,0);
                            enc->tmpstream = pjVar46;
                            if (pjVar46 == (jas_stream_t *)0x0) {
                              pcVar63 = "cannot open tmp file\n";
                              goto LAB_0012148c;
                            }
                            pjVar31 = jpc_ms_create(0xff90);
                            enc->mrk = pjVar31;
                            if (pjVar31 == (jpc_ms_t *)0x0) goto LAB_00121279;
                            (pjVar31->parms).sot.len = 0;
                            (pjVar31->parms).sot.tileno = local_1718;
                            *(undefined2 *)((long)&pjVar31->parms + 0x10) = 0x100;
                            iVar22 = jpc_putms(enc->tmpstream,enc->cstate,pjVar31);
                            if (iVar22 != 0) {
                              pcVar63 = "cannot write SOT marker\n";
                              goto LAB_0012148c;
                            }
                            jpc_ms_destroy(enc->mrk);
                            enc->mrk = (jpc_ms_t *)0x0;
                            if (local_1748->numcmpts != 0) {
                              uVar74 = 0;
                              do {
                                if ((*(jpc_enc_tcmpt_t **)((long)local_1770 + 0x58))[uVar74].
                                    numrlvls != (uint)(local_1748->tccp).maxrlvls) {
                                  pjVar31 = jpc_ms_create(0xff52);
                                  enc->mrk = pjVar31;
                                  if (pjVar31 == (jpc_ms_t *)0x0) goto LAB_00121279;
                                  pjVar64 = *(jpc_enc_tcmpt_t **)((long)local_1770 + 0x58);
                                  (pjVar31->parms).cod.compparms.csty = '\0';
                                  uVar24 = pjVar64->numrlvls;
                                  (pjVar31->parms).cod.compparms.numdlvls = (char)uVar24 + 0xff;
                                  (pjVar31->parms).cod.prg =
                                       *(uint_fast8_t *)((long)local_1770 + 0x29);
                                  *(ulong *)((long)&pjVar31->parms + 8) =
                                       (ulong)*(uint *)((long)local_1770 + 0x2c);
                                  (pjVar31->parms).cod.compparms.cblkwidthval =
                                       (char)pjVar64->cblkwidthexpn + 0xfe;
                                  (pjVar31->parms).cod.compparms.cblkheightval =
                                       (char)pjVar64->cblkheightexpn + 0xfe;
                                  (pjVar31->parms).cod.compparms.cblksty =
                                       (uint_fast8_t)pjVar64->cblksty;
                                  (pjVar31->parms).cod.compparms.qmfbid =
                                       (uint_fast8_t)pjVar64->qmfbid;
                                  (pjVar31->parms).sot.partno =
                                       *(uint_fast8_t *)local_1770->prcwidthexpns != '\0';
                                  if ((ulong)uVar24 != 0) {
                                    piVar61 = &pjVar64->rlvls->prcheightexpn;
                                    uVar75 = 0;
                                    do {
                                      *(char *)((long)&pjVar31->parms + uVar75 * 2 + 0x20) =
                                           (char)piVar61[-1];
                                      *(char *)((long)&pjVar31->parms + uVar75 * 2 + 0x21) =
                                           (char)*piVar61;
                                      uVar75 = uVar75 + 1;
                                      piVar61 = piVar61 + 0x1a;
                                    } while (uVar24 != uVar75);
                                  }
                                  iVar22 = jpc_putms(enc->tmpstream,enc->cstate,pjVar31);
                                  if (iVar22 != 0) goto LAB_00121279;
                                  jpc_ms_destroy(enc->mrk);
                                  enc->mrk = (jpc_ms_t *)0x0;
                                }
                                uVar74 = (ulong)((int)uVar74 + 1);
                              } while (uVar74 < local_1748->numcmpts);
                            }
                            if (local_1748->numcmpts != 0) {
                              pjVar64 = *(jpc_enc_tcmpt_t **)((long)local_1770 + 0x58);
                              uVar55 = 0;
                              do {
                                uVar24 = (uint)local_1748->ccps[uVar55].numstepsizes;
                                if (pjVar64->numstepsizes == uVar24) {
                                  if (0 < (int)uVar24) {
                                    uVar74 = 0;
                                    do {
                                      if (local_1748->ccps[uVar55].stepsizes[uVar74] !=
                                          pjVar64->stepsizes[uVar74]) goto LAB_00120d8f;
                                      uVar74 = uVar74 + 1;
                                    } while ((uVar24 & 0x7fffffff) != uVar74);
                                  }
                                }
                                else {
LAB_00120d8f:
                                  pjVar31 = jpc_ms_create(0xff5d);
                                  enc->mrk = pjVar31;
                                  if (pjVar31 == (jpc_ms_t *)0x0) goto LAB_00121279;
                                  (pjVar31->parms).sot.tileno = uVar55;
                                  (pjVar31->parms).cod.compparms.cblksty =
                                       (local_1748->tccp).numgbits;
                                  (pjVar31->parms).coc.compparms.csty =
                                       (pjVar64->qmfbid == 0) * '\x02';
                                  *(int *)((long)&pjVar31->parms + 0xc) = pjVar64->numstepsizes;
                                  (pjVar31->parms).ppm.data = (uchar *)pjVar64->stepsizes;
                                  iVar22 = jpc_putms(enc->tmpstream,enc->cstate,pjVar31);
                                  if (iVar22 != 0) goto LAB_00121279;
                                  (pjVar31->parms).siz.height = 0;
                                  jpc_ms_destroy(enc->mrk);
                                  enc->mrk = (jpc_ms_t *)0x0;
                                }
                                uVar55 = (uint_fast16_t)((int)uVar55 + 1);
                                pjVar64 = pjVar64 + 1;
                              } while (uVar55 < local_1748->numcmpts);
                            }
                            pjVar31 = jpc_ms_create(0xff93);
                            enc->mrk = pjVar31;
                            if (pjVar31 == (jpc_ms_t *)0x0) goto LAB_00121279;
                            iVar22 = jpc_putms(enc->tmpstream,enc->cstate,pjVar31);
                            if (iVar22 != 0) {
                              pcVar63 = "cannot write SOD marker\n";
                              goto LAB_0012148c;
                            }
                            jpc_ms_destroy(enc->mrk);
                            enc->mrk = (jpc_ms_t *)0x0;
                            uVar74 = enc->tmpstream->rwcnt_;
                            if ((long)uVar74 < 0) {
                              __assert_fail("tilehdrlen >= 0",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                                            ,0x557,"int jpc_enc_encodemainbody(jpc_enc_t *)");
                            }
                            iVar22 = jpc_enc_enccblks(enc);
                            if (iVar22 != 0) goto LAB_001214b9;
                            local_1748 = enc->cp;
                            lVar76 = *(uint_fast32_t *)&local_1770->qmfbid - (long)local_1770->rlvls
                            ;
                            auVar79._8_4_ = (int)((ulong)lVar76 >> 0x20);
                            auVar79._0_8_ = lVar76;
                            auVar79._12_4_ = 0x45300000;
                            lVar68 = (long)local_1770->tsfb - (long)local_1770->data;
                            auVar88._8_4_ = (int)((ulong)lVar68 >> 0x20);
                            auVar88._0_8_ = lVar68;
                            auVar88._12_4_ = 0x45300000;
                            lVar57 = (local_1748->refgrdheight - local_1748->imgareatly) *
                                     (local_1748->refgrdwidth - local_1748->imgareatlx);
                            auVar81._8_4_ = (int)((ulong)lVar57 >> 0x20);
                            auVar81._0_8_ = lVar57;
                            auVar81._12_4_ = 0x45300000;
                            dVar78 = (((auVar88._8_8_ - 1.9342813113834067e+25) +
                                      ((double)CONCAT44(0x43300000,(int)lVar68) - 4503599627370496.0
                                      )) * ((auVar79._8_8_ - 1.9342813113834067e+25) +
                                           ((double)CONCAT44(0x43300000,(int)lVar76) -
                                           4503599627370496.0))) /
                                     ((auVar81._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)lVar57) - 4503599627370496.0)
                                     );
                            uVar27 = local_1748->rawsize;
                            auVar82._8_4_ = (int)(uVar27 >> 0x20);
                            auVar82._0_8_ = uVar27;
                            auVar82._12_4_ = 0x45300000;
                            dVar87 = ((auVar82._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)uVar27) - 4503599627370496.0)
                                     ) * dVar78;
                            uVar75 = (ulong)dVar87;
                            *(ulong *)((long)local_1770 + 0x60) =
                                 (long)(dVar87 - 9.223372036854776e+18) & (long)uVar75 >> 0x3f |
                                 uVar75;
                            uVar24 = *(uint *)((long)local_1770 + 0x2c);
                            uVar51 = uVar24 - 1;
                            if (uVar51 != 0) {
                              pjVar35 = (local_1748->tcp).ilyrrates;
                              puVar37 = *(uint_fast32_t **)((long)local_1770 + 0x48);
                              uVar75 = 0;
                              do {
                                uVar27 = *(uint_fast32_t *)((long)local_1770 + 0x60);
                                auVar83._8_4_ = (int)(uVar27 >> 0x20);
                                auVar83._0_8_ = uVar27;
                                auVar83._12_4_ = 0x45300000;
                                dVar87 = (double)pjVar35[uVar75] * 0.0001220703125 *
                                         ((auVar83._8_8_ - 1.9342813113834067e+25) +
                                         ((double)CONCAT44(0x43300000,(int)uVar27) -
                                         4503599627370496.0));
                                uVar71 = (ulong)dVar87;
                                puVar37[uVar75] =
                                     (long)(dVar87 - 9.223372036854776e+18) & (long)uVar71 >> 0x3f |
                                     uVar71;
                                uVar75 = uVar75 + 1;
                              } while (uVar51 != uVar75);
                            }
                            if (local_1748->totalsize == 0xffffffffffffffff) {
                              uVar27 = 0xffffffffffffffff;
                            }
                            else {
                              auVar84._0_8_ = (double)CONCAT44(0x43300000,(int)enc->mainbodysize);
                              auVar84._8_4_ = (int)(enc->mainbodysize >> 0x20);
                              auVar84._12_4_ = 0x45300000;
                              dVar78 = dVar78 * ((auVar84._8_8_ - 1.9342813113834067e+25) +
                                                (auVar84._0_8_ - 4503599627370496.0));
                              uVar75 = (ulong)dVar78;
                              uVar27 = (long)(dVar78 - 9.223372036854776e+18) & (long)uVar75 >> 0x3f
                                       | uVar75;
                            }
                            (*(uint_fast32_t **)((long)local_1770 + 0x48))[uVar51] = uVar27;
                            if ((ulong)uVar24 != 0) {
                              puVar37 = *(uint_fast32_t **)((long)local_1770 + 0x48);
                              uVar75 = 0;
                              do {
                                uVar71 = puVar37[uVar75];
                                if (uVar71 != 0xffffffffffffffff) {
                                  uVar27 = 0;
                                  if (uVar74 <= uVar71) {
                                    uVar27 = uVar71 - uVar74;
                                  }
                                  puVar37[uVar75] = uVar27;
                                }
                                uVar75 = uVar75 + 1;
                              } while (uVar24 != uVar75);
                            }
                            iVar22 = rateallocate(enc,uVar24,
                                                  *(uint_fast32_t **)((long)local_1770 + 0x48));
                            if (iVar22 != 0) goto LAB_00121279;
                            iVar22 = jpc_enc_encodetiledata(enc);
                            if (iVar22 != 0) {
                              pcVar63 = "dotile failed\n";
                              goto LAB_0012148c;
                            }
                            pjVar46 = enc->tmpstream;
                            uVar27 = jas_stream_tell(pjVar46);
                            lVar76 = jas_stream_seek(pjVar46,6,0);
                            if (lVar76 < 0) goto LAB_00121279;
                            jpc_putuint32(enc->tmpstream,uVar27);
                            lVar76 = jas_stream_seek(enc->tmpstream,0,0);
                            if ((lVar76 < 0) ||
                               (iVar22 = jpc_putdata(enc->out,enc->tmpstream,-1), iVar22 != 0))
                            goto LAB_00121279;
                            enc->len = enc->len + uVar27;
                            jas_stream_close(enc->tmpstream);
                            enc->tmpstream = (jas_stream_t *)0x0;
                            jpc_enc_tile_destroy(enc->curtile);
                            enc->curtile = (jpc_enc_tile_t *)0x0;
                            local_1718 = local_1718 + 1;
                          } while ((long)local_1718 < (long)(int)local_1748->numtiles);
                        }
                        pjVar31 = jpc_ms_create(0xffd9);
                        enc->mrk = pjVar31;
                        if (pjVar31 == (jpc_ms_t *)0x0) {
                          pcVar63 = "cannot create EOC marker\n";
                        }
                        else {
                          iVar22 = jpc_putms(enc->out,enc->cstate,pjVar31);
                          if (iVar22 == 0) {
                            jpc_ms_destroy(enc->mrk);
                            enc->mrk = (jpc_ms_t *)0x0;
                            iVar22 = jas_stream_flush(enc->out);
                            if (iVar22 == 0) {
                              jpc_enc_destroy(enc);
                              return 0;
                            }
                            pcVar63 = "stream flush failed\n";
                          }
                          else {
                            pcVar63 = "cannot write EOC marker\n";
                          }
                        }
                        pjVar25 = (jpc_enc_cp_t *)0x0;
                        goto LAB_0011f097;
                      }
                    }
                  }
                  else {
                    pcVar63 = "cannot write COD marker\n";
                  }
                }
              }
              else {
                pcVar63 = "cannot write COM marker\n";
              }
            }
          }
          else {
            pcVar63 = "cannot write SIZ marker\n";
          }
        }
      }
      else {
        pcVar63 = "cannot write SOC marker\n";
      }
    }
LAB_0011f084:
    jas_eprintf(pcVar63);
LAB_0011f08e:
    pcVar63 = "cannot encode main header\n";
  }
  pjVar25 = (jpc_enc_cp_t *)0x0;
LAB_0011f097:
  jas_eprintf(pcVar63);
  if (pjVar25 != (jpc_enc_cp_t *)0x0) {
    jpc_enc_cp_destroy(pjVar25);
  }
  if (enc != (jpc_enc_t *)0x0) {
    jpc_enc_destroy(enc);
  }
  jas_eprintf("jpc_encode failed\n");
  return -1;
}

Assistant:

int jpc_encode(jas_image_t *image, jas_stream_t *out, const char *optstr)
{
	jpc_enc_t *enc;
	jpc_enc_cp_t *cp;

	enc = 0;
	cp = 0;

	jpc_initluts();

	if (!(cp = cp_create(optstr, image))) {
		jas_eprintf("invalid JP encoder options\n");
		goto error;
	}

	if (!(enc = jpc_enc_create(cp, out, image))) {
		jas_eprintf("jpc_enc_create failed\n");
		goto error;
	}
	cp = 0;

	/* Encode the main header. */
	if (jpc_enc_encodemainhdr(enc)) {
		jas_eprintf("cannot encode main header\n");
		goto error;
	}

	/* Encode the main body.  This constitutes most of the encoding work. */
	if (jpc_enc_encodemainbody(enc)) {
		jas_eprintf("cannot encode main body\n");
		goto error;
	}

	/* Write EOC marker segment. */
	if (!(enc->mrk = jpc_ms_create(JPC_MS_EOC))) {
		jas_eprintf("cannot create EOC marker\n");
		goto error;
	}
	if (jpc_putms(enc->out, enc->cstate, enc->mrk)) {
		jas_eprintf("cannot write EOC marker\n");
		goto error;
	}
	jpc_ms_destroy(enc->mrk);
	enc->mrk = 0;

	if (jas_stream_flush(enc->out)) {
		jas_eprintf("stream flush failed\n");
		goto error;
	}

	jpc_enc_destroy(enc);

	return 0;

error:
	if (cp) {
		jpc_enc_cp_destroy(cp);
	}
	if (enc) {
		jpc_enc_destroy(enc);
	}
	jas_eprintf("jpc_encode failed\n");
	return -1;
}